

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result_conflict __thiscall
testing::internal::FunctionMocker<unsigned_long_(pstore::gsl::not_null<void_*>,_unsigned_long)>::
PerformDefaultAction
          (FunctionMocker<unsigned_long_(pstore::gsl::not_null<void_*>,_unsigned_long)> *this,
          ArgumentTuple *args,string *call_description)

{
  OnCallSpec<unsigned_long_(pstore::gsl::not_null<void_*>,_unsigned_long)> *this_00;
  Action<unsigned_long_(pstore::gsl::not_null<void_*>,_unsigned_long)> *this_01;
  Result RVar1;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  ArgumentTuple local_28;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 == (OnCallSpec<unsigned_long_(pstore::gsl::not_null<void_*>,_unsigned_long)> *)0x0) {
    std::operator+(&bStack_48,call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    RVar1 = DefaultValue<unsigned_long>::Get();
    std::__cxx11::string::~string((string *)&bStack_48);
  }
  else {
    this_01 = OnCallSpec<unsigned_long_(pstore::gsl::not_null<void_*>,_unsigned_long)>::GetAction
                        (this_00);
    local_28.super__Tuple_impl<0UL,_pstore::gsl::not_null<void_*>,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)
         (args->super__Tuple_impl<0UL,_pstore::gsl::not_null<void_*>,_unsigned_long>).
         super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
         _M_head_impl;
    local_28.super__Tuple_impl<0UL,_pstore::gsl::not_null<void_*>,_unsigned_long>.
    super__Head_base<0UL,_pstore::gsl::not_null<void_*>,_false>._M_head_impl.ptr_ =
         (not_null<void_*>)
         (args->super__Tuple_impl<0UL,_pstore::gsl::not_null<void_*>,_unsigned_long>).
         super__Head_base<0UL,_pstore::gsl::not_null<void_*>,_false>._M_head_impl.ptr_;
    RVar1 = Action<unsigned_long_(pstore::gsl::not_null<void_*>,_unsigned_long)>::Perform
                      (this_01,&local_28);
  }
  return RVar1;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }